

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_ext_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 val,MemOp opc)

{
  MemOp opc_local;
  TCGv_i64 val_local;
  TCGv_i64 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  switch(opc & MO_SSIZE) {
  case MO_8:
    tcg_gen_ext8u_i64_tricore(tcg_ctx,ret,val);
    break;
  case MO_16:
    tcg_gen_ext16u_i64_tricore(tcg_ctx,ret,val);
    break;
  case MO_32:
    tcg_gen_ext32u_i64_tricore(tcg_ctx,ret,val);
    break;
  default:
    tcg_gen_mov_i64_tricore(tcg_ctx,ret,val);
    break;
  case MO_ASHIFT:
    tcg_gen_ext8s_i64_tricore(tcg_ctx,ret,val);
    break;
  case MO_LESW:
    tcg_gen_ext16s_i64_tricore(tcg_ctx,ret,val);
    break;
  case MO_LESL:
    tcg_gen_ext32s_i64_tricore(tcg_ctx,ret,val);
  }
  return;
}

Assistant:

static void tcg_gen_ext_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 val, MemOp opc)
{
    switch (opc & MO_SSIZE) {
    case MO_SB:
        tcg_gen_ext8s_i64(tcg_ctx, ret, val);
        break;
    case MO_UB:
        tcg_gen_ext8u_i64(tcg_ctx, ret, val);
        break;
    case MO_SW:
        tcg_gen_ext16s_i64(tcg_ctx, ret, val);
        break;
    case MO_UW:
        tcg_gen_ext16u_i64(tcg_ctx, ret, val);
        break;
    case MO_SL:
        tcg_gen_ext32s_i64(tcg_ctx, ret, val);
        break;
    case MO_UL:
        tcg_gen_ext32u_i64(tcg_ctx, ret, val);
        break;
    default:
        tcg_gen_mov_i64(tcg_ctx, ret, val);
        break;
    }
}